

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_worker_startup(void)

{
  fio_defer_task_s task;
  uint uVar1;
  fio_defer_thread_pool_s *pool;
  
  if ((fio_data->workers == 1) || (fio_data->is_worker != '\0')) {
    fio_state_callback_force(FIO_CALL_ON_START);
    fio_state_callback_clear(FIO_CALL_ON_START);
  }
  if (fio_data->workers == 1) {
    fio_data->is_worker = '\x01';
  }
  else if (fio_data->is_worker == '\0') {
    fio_data->threads = 1;
  }
  else if (3 < FIO_LOG_LEVEL) {
    uVar1 = getpid();
    FIO_LOG2STDERR("INFO: %d is running.",(ulong)uVar1);
  }
  fio_data->need_review = '\x01';
  task.arg2 = (void *)0x0;
  task.func = fio_cycle;
  task.arg1 = (void *)0x0;
  fio_defer_push_task_fn(task,&task_queue_normal);
  fio_defer_thread_signal();
  if (fio_data->threads < 2) {
    fio_defer_perform();
  }
  else {
    pool = fio_defer_thread_pool_new((ulong)fio_data->threads);
    fio_defer_thread_pool_join(pool);
  }
  return;
}

Assistant:

static void fio_worker_startup(void) {
  /* Call the on_start callbacks for worker processes. */
  if (fio_data->workers == 1 || fio_data->is_worker) {
    fio_state_callback_force(FIO_CALL_ON_START);
    fio_state_callback_clear(FIO_CALL_ON_START);
  }

  if (fio_data->workers == 1) {
    /* Single Process - the root is also a worker */
    fio_data->is_worker = 1;
  } else if (fio_data->is_worker) {
    /* Worker Process */
    FIO_LOG_INFO("%d is running.", (int)getpid());
  } else {
    /* Root Process should run in single thread mode */
    fio_data->threads = 1;
  }

  /* require timeout review */
  fio_data->need_review = 1;

  /* the cycle task will loop by re-scheduling until it's time to finish */
  fio_defer_push_task(fio_cycle, NULL, NULL);

  /* A single thread doesn't need a pool. */
  if (fio_data->threads > 1) {
    fio_defer_thread_pool_join(fio_defer_thread_pool_new(fio_data->threads));
  } else {
    fio_defer_perform();
  }
}